

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfHeader.cpp
# Opt level: O2

uint64_t __thiscall Imf_3_4::Header::writeTo(Header *this,OStream *os,bool isTiled)

{
  int iVar1;
  TypedAttribute<Imf_3_4::PreviewImage> *pTVar2;
  char *v;
  undefined4 extraout_var;
  _Base_ptr p_Var4;
  string s;
  StdOSStream oss;
  uint64_t uVar3;
  
  pTVar2 = findTypedAttribute<Imf_3_4::TypedAttribute<Imf_3_4::PreviewImage>>(this,"preview");
  uVar3 = 0;
  for (p_Var4 = (this->_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->_map)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(char *)(p_Var4 + 1));
    v = (char *)(**(code **)(**(long **)(p_Var4 + 9) + 0x10))();
    Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,v);
    StdOSStream::StdOSStream(&oss);
    (**(code **)(**(long **)(p_Var4 + 9) + 0x20))(*(long **)(p_Var4 + 9),&oss,2);
    StdOSStream::str_abi_cxx11_(&s,&oss);
    Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,(uint)s._M_string_length);
    if (*(TypedAttribute<Imf_3_4::PreviewImage> **)(p_Var4 + 9) == pTVar2) {
      iVar1 = (*os->_vptr_OStream[3])(os);
      uVar3 = CONCAT44(extraout_var,iVar1);
    }
    (*os->_vptr_OStream[2])(os,s._M_dataplus._M_p,(ulong)(uint)s._M_string_length);
    std::__cxx11::string::~string((string *)&s);
    StdOSStream::~StdOSStream(&oss);
  }
  Xdr::write<Imf_3_4::StreamIO,Imf_3_4::OStream>(os,"");
  return uVar3;
}

Assistant:

uint64_t
Header::writeTo (
    OPENEXR_IMF_INTERNAL_NAMESPACE::OStream& os, bool isTiled) const
{
    //
    // Write a "magic number" to identify the file as an image file.
    // Write the current file format version number.
    //

    int version = EXR_VERSION;

    //
    // Write all attributes.  If we have a preview image attribute,
    // keep track of its position in the file.
    //

    uint64_t previewPosition = 0;

    const Attribute* preview =
        findTypedAttribute<PreviewImageAttribute> ("preview");

    for (ConstIterator i = begin (); i != end (); ++i)
    {
        //
        // Write the attribute's name and type.
        //

        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, i.name ());
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (
            os, i.attribute ().typeName ());

        //
        // Write the size of the attribute value,
        // and the value itself.
        //

        StdOSStream oss;
        i.attribute ().writeValueTo (oss, version);

        std::string s = oss.str ();
        OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
            OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, (int) s.length ());

        if (&i.attribute () == preview) previewPosition = os.tellp ();

        os.write (s.data (), int (s.length ()));
    }

    //
    // Write zero-length attribute name to mark the end of the header.
    //

    OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::write<
        OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (os, "");

    return previewPosition;
}